

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QListWidgetItem_*>::removeAt(QList<QListWidgetItem_*> *this,qsizetype i)

{
  char *in_RSI;
  QList<QListWidgetItem_*> *in_RDI;
  
  remove(in_RDI,in_RSI);
  return;
}

Assistant:

void removeAt(qsizetype i) { remove(i); }